

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O1

bool slang::svGlobMatchesInternal(string_view path,string_view pattern)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  string_view sVar4;
  string_view sVar5;
  string_view local_48;
  string_view local_38;
  
  local_48._M_str = path._M_str;
  local_48._M_len = path._M_len;
  local_38._M_str = pattern._M_str;
  local_38._M_len = pattern._M_len;
  while( true ) {
    sVar2 = local_38._M_len;
    if ((local_38._M_len == 0) || (local_48._M_len == 0)) {
      nextSegment(&local_48);
      if (sVar2 != 0) {
        return false;
      }
      return local_48._M_len == 0;
    }
    if ((2 < local_38._M_len) &&
       ((char)*(short *)((long)local_38._M_str + 2) == '.' && *(short *)local_38._M_str == 0x2e2e))
    break;
    sVar4 = nextSegment(&local_48);
    sVar5 = nextSegment(&local_38);
    bVar1 = matches(sVar4,sVar5);
    if (!bVar1) {
      return false;
    }
  }
  if (local_38._M_len < 3) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",3,
               local_38._M_len);
  }
  sVar2 = local_38._M_len - 3;
  pcVar3 = (char *)((long)local_38._M_str + 3);
  local_38._M_len = sVar2;
  local_38._M_str = pcVar3;
  do {
    sVar4._M_str = local_48._M_str;
    sVar4._M_len = local_48._M_len;
    sVar5._M_str = pcVar3;
    sVar5._M_len = sVar2;
    bVar1 = svGlobMatchesInternal(sVar4,sVar5);
    if (bVar1) {
      return bVar1;
    }
    nextSegment(&local_48);
  } while (local_48._M_len != 0);
  return bVar1;
}

Assistant:

static bool svGlobMatchesInternal(std::string_view path, std::string_view pattern) {
    while (!pattern.empty() && !path.empty()) {
        // Special case for recursive directory search.
        if (pattern.starts_with("..."sv)) {
            pattern = pattern.substr(3);
            do {
                if (svGlobMatchesInternal(path, pattern))
                    return true;

                nextSegment(path);
            } while (!path.empty());

            return false;
        }

        // If the next segments don't match then we don't match overall.
        if (!matches(nextSegment(path), nextSegment(pattern))) {
            return false;
        }
    }

    // We match if:
    // 1) we used up the whole pattern
    // 2) pattern ended in a separator and the next path segment is the last (i.e. the file name)
    //    -- OR --
    //    pattern didn't end in a separator and we matched the whole path (so it's empty now)
    nextSegment(path);
    return pattern.empty() && path.empty();
}